

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O0

void __thiscall MainWindow::closeEvent(MainWindow *this,QCloseEvent *evt)

{
  bool bVar1;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QByteArray local_118;
  QVariant local_100;
  QByteArray local_e0;
  QVariant local_c8;
  QByteArray local_a8;
  QVariant local_90;
  QByteArray local_70;
  QVariant local_58;
  QSettings local_28 [8];
  QSettings settings;
  QCloseEvent *evt_local;
  MainWindow *this_local;
  
  bVar1 = maybeSave(this);
  if (bVar1) {
    QSettings::QSettings(local_28,(QObject *)0x0);
    QSettings::beginGroup((QString *)local_28);
    QWidget::saveGeometry();
    QVariant::QVariant(&local_58,(QByteArray *)&local_70);
    QSettings::setValue((QString *)local_28,(QVariant *)MainWindowTU::KEY_GEOMETRY);
    QVariant::~QVariant(&local_58);
    QByteArray::~QByteArray(&local_70);
    QMainWindow::saveState((int)&local_a8);
    QVariant::QVariant(&local_90,(QByteArray *)&local_a8);
    QSettings::setValue((QString *)local_28,(QVariant *)MainWindowTU::KEY_WINDOW_STATE);
    QVariant::~QVariant(&local_90);
    QByteArray::~QByteArray(&local_a8);
    QSplitter::saveState();
    QVariant::QVariant(&local_c8,(QByteArray *)&local_e0);
    QSettings::setValue((QString *)local_28,(QVariant *)MainWindowTU::KEY_HSPLITTER);
    QVariant::~QVariant(&local_c8);
    QByteArray::~QByteArray(&local_e0);
    QSplitter::saveState();
    QVariant::QVariant(&local_100,(QByteArray *)&local_118);
    __fd = 0x2dfb48;
    QSettings::setValue((QString *)local_28,(QVariant *)MainWindowTU::KEY_VSPLITTER);
    QVariant::~QVariant(&local_100);
    QByteArray::~QByteArray(&local_118);
    QEvent::accept((QEvent *)evt,__fd,__addr,in_RCX);
    QSettings::~QSettings(local_28);
  }
  else {
    QEvent::ignore((QEvent *)evt);
  }
  return;
}

Assistant:

void MainWindow::closeEvent(QCloseEvent *evt) {
    if (maybeSave()) {
        // user saved or discarded changes, close the window
        #ifdef QT_DEBUG
        if (mSaveConfig) {
        #endif
            QSettings settings;
            settings.beginGroup(TU::KEY_MAIN_WINDOW);
            settings.setValue(TU::KEY_GEOMETRY, saveGeometry());
            settings.setValue(TU::KEY_WINDOW_STATE, saveState(TU::WINDOW_STATE_VERSION));
            // splitters
            settings.setValue(TU::KEY_HSPLITTER, mHSplitter->saveState());
            settings.setValue(TU::KEY_VSPLITTER, mVSplitter->saveState());
        #ifdef QT_DEBUG
        }
        #endif
        evt->accept();
    } else {
        // user aborted closing, ignore this event
        evt->ignore();
    }
    
}